

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::GetFlags
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *l)

{
  cmGeneratorTarget *pcVar1;
  cmLocalCommonGenerator *pcVar2;
  bool bVar3;
  char *pcVar4;
  pointer ppVar5;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_basic_string<char>_>_&>::value,_pair<iterator,_bool>_>
  _Var6;
  undefined1 local_190 [8];
  value_type entry;
  string local_148;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_79;
  string local_78;
  char *local_58;
  char *lang;
  string flags;
  _Self local_28;
  iterator i;
  string *l_local;
  cmCommonTargetGenerator *this_local;
  
  i._M_node = (_Base_ptr)l;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->FlagsByLanguage,l);
  flags.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->FlagsByLanguage);
  bVar3 = std::operator==(&local_28,(_Self *)((long)&flags.field_2 + 8));
  if (bVar3) {
    std::__cxx11::string::string((string *)&lang);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_58 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar4,&local_79);
    AddFeatureFlags(this,(string *)&lang,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pcVar4 = local_58;
    pcVar1 = this->GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,pcVar4,&local_b1);
    cmLocalGenerator::AddArchitectureFlags
              (&pcVar2->super_cmLocalGenerator,(string *)&lang,pcVar1,&local_b0,&this->ConfigName);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            i._M_node,"Fortran");
    if (bVar3) {
      AddFortranFlags(this,(string *)&lang);
    }
    pcVar4 = local_58;
    pcVar1 = this->GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,pcVar4,&local_d9);
    cmLocalGenerator::AddCMP0018Flags
              (&pcVar2->super_cmLocalGenerator,(string *)&lang,pcVar1,&local_d8,&this->ConfigName);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    pcVar4 = local_58;
    pcVar1 = this->GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,pcVar4,&local_101);
    cmLocalGenerator::AddVisibilityPresetFlags
              (&pcVar2->super_cmLocalGenerator,(string *)&lang,pcVar1,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    pcVar2 = this->LocalGenerator;
    pcVar4 = cmMakefile::GetDefineFlags(this->Makefile);
    (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar2,&lang,pcVar4);
    pcVar2 = this->LocalGenerator;
    GetFrameworkFlags(&local_128,this,(string *)i._M_node);
    (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])(pcVar2,&lang,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    pcVar4 = local_58;
    pcVar1 = this->GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,pcVar4,(allocator *)(entry.second.field_2._M_local_buf + 0xf));
    cmLocalGenerator::AddCompileOptions
              (&pcVar2->super_cmLocalGenerator,(string *)&lang,pcVar1,&local_148,&this->ConfigName);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)(entry.second.field_2._M_local_buf + 0xf));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_190,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i._M_node,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lang);
    _Var6 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->FlagsByLanguage,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_190);
    local_28._M_node = (_Base_ptr)_Var6.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_190);
    std::__cxx11::string::~string((string *)&lang);
  }
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_28);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar5->second);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetFlags(const std::string &l)
{
  ByLanguageMap::iterator i = this->FlagsByLanguage.find(l);
  if (i == this->FlagsByLanguage.end())
    {
    std::string flags;
    const char *lang = l.c_str();

    // Add language feature flags.
    this->AddFeatureFlags(flags, lang);

    this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                               lang, this->ConfigName);

    // Fortran-specific flags computed for this target.
    if(l == "Fortran")
      {
      this->AddFortranFlags(flags);
      }

    this->LocalGenerator->AddCMP0018Flags(flags, this->GeneratorTarget,
                                          lang, this->ConfigName);

    this->LocalGenerator->AddVisibilityPresetFlags(flags,
                                                   this->GeneratorTarget,
                                                   lang);

    // Append old-style preprocessor definition flags.
    this->LocalGenerator->
      AppendFlags(flags, this->Makefile->GetDefineFlags());

    // Add framework directory flags.
    this->LocalGenerator->
      AppendFlags(flags,this->GetFrameworkFlags(l));

    // Add target-specific flags.
    this->LocalGenerator->AddCompileOptions(flags, this->GeneratorTarget,
                                            lang, this->ConfigName);

    ByLanguageMap::value_type entry(l, flags);
    i = this->FlagsByLanguage.insert(entry).first;
    }
  return i->second;
}